

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_cvttps2pi_x86_64(CPUX86State *env,MMXReg *d,ZMMReg *s)

{
  byte bVar1;
  byte bVar2;
  float32 fVar3;
  uint32_t uVar4;
  
  fVar3 = s->_s_ZMMReg[0];
  bVar1 = (env->sse_status).float_exception_flags;
  (env->sse_status).float_exception_flags = '\0';
  uVar4 = float32_to_int32_round_to_zero_x86_64(fVar3,&env->sse_status);
  bVar2 = (env->sse_status).float_exception_flags;
  if ((bVar2 & 1) != 0) {
    uVar4 = 0x80000000;
  }
  (env->sse_status).float_exception_flags = bVar1 | bVar2;
  d->_l_MMXReg[0] = uVar4;
  fVar3 = s->_s_ZMMReg[1];
  bVar1 = (env->sse_status).float_exception_flags;
  (env->sse_status).float_exception_flags = '\0';
  uVar4 = float32_to_int32_round_to_zero_x86_64(fVar3,&env->sse_status);
  bVar2 = (env->sse_status).float_exception_flags;
  if ((bVar2 & 1) != 0) {
    uVar4 = 0x80000000;
  }
  (env->sse_status).float_exception_flags = bVar1 | bVar2;
  d->_l_MMXReg[1] = uVar4;
  return;
}

Assistant:

void helper_cvttps2pi(CPUX86State *env, MMXReg *d, ZMMReg *s)
{
    d->MMX_L(0) = x86_float32_to_int32_round_to_zero(s->ZMM_S(0), &env->sse_status);
    d->MMX_L(1) = x86_float32_to_int32_round_to_zero(s->ZMM_S(1), &env->sse_status);
}